

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O1

Sle_Man_t * Sle_ManAlloc(Gia_Man_t *pGia,int nLevels,int fVerbose)

{
  int iVar1;
  Sle_Man_t *pSVar2;
  Vec_Bit_t *vMask;
  Vec_Int_t *vCuts;
  Vec_Wec_t *pVVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  pSVar2 = (Sle_Man_t *)calloc(1,0xa0);
  pSVar2->pGia = pGia;
  pSVar2->nLevels = nLevels;
  pSVar2->fVerbose = fVerbose;
  vMask = Sle_ManInternalNodeMask(pGia);
  pSVar2->vMask = vMask;
  vCuts = Sle_ManComputeCuts(pGia,4,fVerbose);
  pSVar2->vCuts = vCuts;
  pVVar3 = Sle_ManCollectCutFanins(pGia,vCuts,vMask);
  pSVar2->vCutFanins = pVVar3;
  iVar1 = pGia->nObjs;
  pVVar3 = (Vec_Wec_t *)malloc(0x10);
  iVar6 = 8;
  if (6 < iVar1 - 1U) {
    iVar6 = iVar1;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar6;
  if (iVar6 == 0) {
    pVVar4 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar4 = (Vec_Int_t *)calloc((long)iVar6,0x10);
  }
  pVVar3->pArray = pVVar4;
  pVVar3->nSize = iVar1;
  pSVar2->vFanoutEdges = pVVar3;
  pVVar3 = (Vec_Wec_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  pVVar4 = (Vec_Int_t *)calloc(100,0x10);
  pVVar3->pArray = pVVar4;
  pSVar2->vEdgeCuts = pVVar3;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar6 = iVar1;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar6;
  lVar8 = (long)iVar6;
  if (iVar6 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc(lVar8 * 4);
  }
  lVar7 = (long)iVar1;
  pVVar4->pArray = piVar5;
  pVVar4->nSize = iVar1;
  if (piVar5 != (int *)0x0) {
    memset(piVar5,0xff,lVar7 * 4);
  }
  pSVar2->vObjMap = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar6;
  if (iVar6 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc(lVar8 * 4);
  }
  pVVar4->pArray = piVar5;
  pVVar4->nSize = iVar1;
  if (piVar5 != (int *)0x0) {
    memset(piVar5,0xff,lVar7 * 4);
  }
  pSVar2->vCutFirst = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar6;
  if (iVar6 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc(lVar8 * 4);
  }
  pVVar4->pArray = piVar5;
  pVVar4->nSize = iVar1;
  if (piVar5 != (int *)0x0) {
    memset(piVar5,0xff,lVar7 * 4);
  }
  pSVar2->vEdgeFirst = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar6;
  if (iVar6 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc(lVar8 << 2);
  }
  pVVar4->pArray = piVar5;
  pVVar4->nSize = iVar1;
  if (piVar5 != (int *)0x0) {
    memset(piVar5,0xff,lVar7 << 2);
  }
  pSVar2->vDelayFirst = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  pSVar2->vPolars = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  pSVar2->vLits = pVVar4;
  iVar1 = Sle_ManComputeDelay(pGia,vCuts);
  pSVar2->nLevels = iVar1;
  return pSVar2;
}

Assistant:

Sle_Man_t * Sle_ManAlloc( Gia_Man_t * pGia, int nLevels, int fVerbose )
{
    Sle_Man_t * p   = ABC_CALLOC( Sle_Man_t, 1 );
    p->pGia         = pGia;
    p->nLevels      = nLevels;
    p->fVerbose     = fVerbose;
    p->vMask        = Sle_ManInternalNodeMask( pGia );
    p->vCuts        = Sle_ManComputeCuts( pGia, 4, fVerbose );
    p->vCutFanins   = Sle_ManCollectCutFanins( pGia, p->vCuts, p->vMask );
    p->vFanoutEdges = Vec_WecStart( Gia_ManObjNum(pGia) );
    p->vEdgeCuts    = Vec_WecAlloc( 100 );
    p->vObjMap      = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    p->vCutFirst    = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    p->vEdgeFirst   = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    p->vDelayFirst  = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    p->vPolars      = Vec_IntAlloc( 100 );
    p->vLits        = Vec_IntAlloc( 100 );
    p->nLevels      = Sle_ManComputeDelay( pGia, p->vCuts );
    return p;
}